

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm2d.c
# Opt level: O1

void inv_txfm2d_add_facade
               (int32_t *input,uint16_t *output,int stride,int32_t *txfm_buf,TX_TYPE tx_type,
               TX_SIZE tx_size,int bd)

{
  int32_t *piVar1;
  uint uVar2;
  long lVar3;
  int *piVar4;
  ushort *puVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int32_t *piVar19;
  char cVar20;
  int iVar21;
  ulong uVar22;
  int8_t stage_range_row [12];
  TXFM_2D_FLIP_CFG cfg;
  code *local_e0;
  ushort *local_b8;
  code *local_a0;
  int8_t local_88 [12];
  int8_t local_7c [12];
  TXFM_2D_FLIP_CFG local_70;
  
  av1_get_inv_txfm_cfg(tx_type,tx_size,&local_70);
  uVar15 = tx_size_wide[local_70.tx_size];
  lVar11 = (long)(int)uVar15;
  uVar2 = tx_size_high[local_70.tx_size];
  iVar21 = 0;
  if (uVar15 != uVar2) {
    if ((int)uVar2 < (int)uVar15) {
      iVar21 = 1;
      if ((uVar2 * 2 == uVar15) || (iVar21 = 2, uVar2 * 4 == uVar15)) goto LAB_0038b4cb;
    }
    else {
      iVar21 = -1;
      if ((uVar15 * 2 == uVar2) || (iVar21 = -2, uVar15 * 4 == uVar2)) goto LAB_0038b4cb;
    }
    iVar21 = 0;
  }
LAB_0038b4cb:
  local_a0 = (code *)0x0;
  av1_gen_inv_stage_range(local_88,local_7c,&local_70,'\0',bd);
  if ((ulong)local_70.txfm_type_col < 0xc) {
    local_a0 = (code *)(&PTR_av1_idct4_005daf80)[local_70.txfm_type_col];
  }
  if ((ulong)local_70.txfm_type_row < 0xc) {
    local_e0 = (code *)(&PTR_av1_idct4_005daf80)[local_70.txfm_type_row];
  }
  else {
    local_e0 = (code *)0x0;
  }
  uVar7 = uVar15;
  if ((int)uVar15 < (int)uVar2) {
    uVar7 = uVar2;
  }
  lVar3 = (long)(int)uVar7;
  iVar18 = -iVar21;
  if (0 < iVar21) {
    iVar18 = iVar21;
  }
  cVar20 = (char)bd + '\b';
  lVar13 = 1L << ((char)bd + 7U & 0x3f);
  piVar1 = txfm_buf + lVar3;
  piVar19 = piVar1 + lVar3;
  lVar6 = lVar13 + -1;
  lVar14 = -lVar13;
  uVar17 = 1;
  if (1 < (int)uVar15) {
    uVar17 = (ulong)uVar15;
  }
  uVar22 = 1;
  if (1 < (int)uVar2) {
    uVar22 = (ulong)uVar2;
  }
  uVar12 = 0;
  do {
    if (iVar18 == 1) {
      uVar8 = 0;
      piVar4 = input;
      do {
        txfm_buf[uVar8] = (int32_t)((long)*piVar4 * 0xb50 + 0x800U >> 0xc);
        uVar8 = uVar8 + 1;
        piVar4 = piVar4 + (int)uVar2;
      } while (uVar17 != uVar8);
      uVar8 = 0;
      do {
        iVar21 = txfm_buf[uVar8];
        if ('\0' < cVar20) {
          lVar9 = (long)txfm_buf[uVar8];
          lVar10 = lVar6;
          if (lVar9 < lVar6) {
            lVar10 = lVar9;
          }
          iVar21 = (int)lVar14;
          if (SBORROW8(lVar9,lVar14) == lVar9 + lVar13 < 0) {
            iVar21 = (int)lVar10;
          }
        }
        txfm_buf[uVar8] = iVar21;
        uVar8 = uVar8 + 1;
      } while (uVar15 != uVar8);
    }
    else {
      uVar8 = 0;
      piVar4 = input;
      do {
        txfm_buf[uVar8] = *piVar4;
        uVar8 = uVar8 + 1;
        piVar4 = piVar4 + (int)uVar2;
      } while (uVar17 != uVar8);
      uVar8 = 0;
      do {
        iVar21 = txfm_buf[uVar8];
        if ('\0' < cVar20) {
          lVar9 = (long)txfm_buf[uVar8];
          lVar10 = lVar6;
          if (lVar9 < lVar6) {
            lVar10 = lVar9;
          }
          iVar21 = (int)lVar14;
          if (SBORROW8(lVar9,lVar14) == lVar9 + lVar13 < 0) {
            iVar21 = (int)lVar10;
          }
        }
        txfm_buf[uVar8] = iVar21;
        uVar8 = uVar8 + 1;
      } while (uVar15 != uVar8);
    }
    (*local_e0)(txfm_buf,piVar19,(int)local_70.cos_bit_row,local_7c);
    (*av1_round_shift_array)(piVar19,uVar15,-(int)*local_70.shift);
    piVar19 = piVar19 + lVar11;
    uVar12 = uVar12 + 1;
    input = input + 1;
  } while (uVar12 != uVar22);
  iVar21 = 10;
  if (10 < bd) {
    iVar21 = bd;
  }
  lVar13 = 1L << ((char)iVar21 + 5U & 0x3f);
  uVar12 = 0;
  lVar6 = lVar3 * 2;
  local_b8 = output;
  do {
    uVar15 = uVar15 - 1;
    if (local_70.lr_flip == 0) {
      uVar8 = 0;
      lVar14 = lVar6;
      do {
        txfm_buf[uVar8] = txfm_buf[lVar14];
        uVar8 = uVar8 + 1;
        lVar14 = lVar14 + lVar11;
      } while (uVar22 != uVar8);
    }
    else {
      lVar14 = (long)(int)uVar15 + lVar3 * 2;
      uVar8 = 0;
      do {
        txfm_buf[uVar8] = txfm_buf[lVar14];
        uVar8 = uVar8 + 1;
        lVar14 = lVar14 + lVar11;
      } while (uVar22 != uVar8);
    }
    uVar8 = 0;
    do {
      iVar18 = txfm_buf[uVar8];
      if ('\0' < (char)((char)iVar21 + '\x06')) {
        lVar10 = (long)txfm_buf[uVar8];
        lVar14 = lVar13 + -1;
        if (lVar10 < lVar13 + -1) {
          lVar14 = lVar10;
        }
        iVar18 = (int)-lVar13;
        if (SBORROW8(lVar10,-lVar13) == lVar10 + lVar13 < 0) {
          iVar18 = (int)lVar14;
        }
      }
      txfm_buf[uVar8] = iVar18;
      uVar8 = uVar8 + 1;
    } while (uVar2 != uVar8);
    (*local_a0)(txfm_buf,piVar1,(int)local_70.cos_bit_col,local_88);
    (*av1_round_shift_array)(piVar1,uVar2,-(int)local_70.shift[1]);
    puVar5 = local_b8;
    uVar8 = uVar22;
    uVar7 = uVar2;
    if (local_70.ud_flip == 0) {
      uVar8 = 0;
      do {
        iVar18 = (uint)*puVar5 + piVar1[uVar8];
        if (bd == 10) {
          if (0x3fe < iVar18) {
            iVar18 = 0x3ff;
          }
        }
        else {
          if (bd == 0xc) {
            iVar16 = 0xfff;
          }
          else {
            iVar16 = 0xff;
          }
          if (iVar16 <= iVar18) {
            iVar18 = iVar16;
          }
        }
        if (iVar18 < 1) {
          iVar18 = 0;
        }
        *puVar5 = (ushort)iVar18;
        uVar8 = uVar8 + 1;
        puVar5 = puVar5 + stride;
      } while (uVar22 != uVar8);
    }
    else {
      do {
        uVar7 = uVar7 - 1;
        iVar18 = (uint)*puVar5 + piVar1[(int)uVar7];
        if (bd == 10) {
          if (0x3fe < iVar18) {
            iVar18 = 0x3ff;
          }
        }
        else {
          if (bd == 0xc) {
            iVar16 = 0xfff;
          }
          else {
            iVar16 = 0xff;
          }
          if (iVar16 <= iVar18) {
            iVar18 = iVar16;
          }
        }
        if (iVar18 < 1) {
          iVar18 = 0;
        }
        *puVar5 = (ushort)iVar18;
        puVar5 = puVar5 + stride;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
    }
    uVar12 = uVar12 + 1;
    lVar6 = lVar6 + 1;
    local_b8 = local_b8 + 1;
  } while (uVar12 != uVar17);
  return;
}

Assistant:

static inline void inv_txfm2d_add_facade(const int32_t *input, uint16_t *output,
                                         int stride, int32_t *txfm_buf,
                                         TX_TYPE tx_type, TX_SIZE tx_size,
                                         int bd) {
  TXFM_2D_FLIP_CFG cfg;
  av1_get_inv_txfm_cfg(tx_type, tx_size, &cfg);
  // Forward shift sum uses larger square size, to be consistent with what
  // av1_gen_inv_stage_range() does for inverse shifts.
  inv_txfm2d_add_c(input, output, stride, &cfg, txfm_buf, tx_size, bd);
}